

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O1

void __thiscall
re2::RegexpGenerator::RunPostfix
          (RegexpGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *post)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  RegexpGenerator *pRVar4;
  int iVar5;
  _Elt_pointer pbVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer pbVar9;
  size_type *psVar10;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *extraout_RDX_01;
  StringPiece *extraout_RDX_02;
  StringPiece *pSVar11;
  StringPiece *extraout_RDX_03;
  ulong uVar12;
  long lVar13;
  _Alloc_hider _Var14;
  string a;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  regexps;
  string b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  RegexpGenerator *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1d8 = this;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_268,0);
  pbVar9 = (post->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((post->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
    paVar1 = &local_1f8.field_2;
    lVar13 = 0;
    uVar12 = 0;
    do {
      iVar5 = CountArgs((string *)((long)&(pbVar9->_M_dataplus)._M_p + lVar13));
      if (iVar5 == 0) {
LAB_0011be58:
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_268,
                    (value_type *)
                    ((long)&(((post->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                    lVar13));
      }
      else {
        if (iVar5 == 1) {
          pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          local_1b0._0_8_ = local_1b0 + 0x10;
          pcVar2 = pbVar6[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,pcVar2,pcVar2 + pbVar6[-1]._M_string_length);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268);
          StringPrintf_abi_cxx11_
                    (&local_218,
                     *(char **)((long)&(((post->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar13),local_1b0._0_8_);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x13e3a8);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1f8.field_2._M_allocated_capacity = *psVar10;
            local_1f8.field_2._8_8_ = plVar7[3];
            local_1f8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar10;
            local_1f8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1f8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_288.field_2._M_allocated_capacity = *psVar10;
            local_288.field_2._8_8_ = plVar7[3];
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar10;
            local_288._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_288._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                     &local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
          psVar3 = &local_218;
          _Var14._M_p = local_218._M_dataplus._M_p;
        }
        else {
          if (iVar5 != 2) {
            LogMessage::LogMessage
                      ((LogMessage *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_generator.cc"
                       ,0xb9,3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),"Bad operator: ",0xe);
            pbVar9 = (post->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),
                       *(char **)((long)&(pbVar9->_M_dataplus)._M_p + lVar13),
                       *(long *)((long)&pbVar9->_M_string_length + lVar13));
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
            goto LAB_0011be58;
          }
          pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          local_1b0._0_8_ = local_1b0 + 0x10;
          pcVar2 = pbVar6[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,pcVar2,pcVar2 + pbVar6[-1]._M_string_length);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268);
          pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          pcVar2 = pbVar6[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,pcVar2,pcVar2 + pbVar6[-1]._M_string_length);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268);
          StringPrintf_abi_cxx11_
                    (&local_1d0,
                     *(char **)((long)&(((post->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar13),local_288._M_dataplus._M_p,local_1b0._0_8_);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x13e3a8);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_218.field_2._M_allocated_capacity = *psVar10;
            local_218.field_2._8_8_ = plVar7[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = *psVar10;
            local_218._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_218._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1f8.field_2._M_allocated_capacity = *psVar10;
            local_1f8.field_2._8_8_ = puVar8[3];
            local_1f8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar10;
            local_1f8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1f8._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                     &local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          psVar3 = &local_288;
          _Var14._M_p = local_288._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var14._M_p != &psVar3->field_2) {
          operator_delete(_Var14._M_p);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
      }
      uVar12 = uVar12 + 1;
      pbVar9 = (post->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
    } while (uVar12 < (ulong)((long)(post->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
  }
  if (((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
      ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
      0x10 != 1) {
    puts("Bad regexp program:");
    pbVar9 = (post->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((post->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
      lVar13 = 8;
      uVar12 = 0;
      pSVar11 = extraout_RDX;
      do {
        local_288._M_dataplus._M_p = *(pointer *)((long)pbVar9 + lVar13 + -8);
        local_288._M_string_length =
             CONCAT44(local_288._M_string_length._4_4_,
                      *(undefined4 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar13));
        CEscape_abi_cxx11_((string *)local_1b0,(re2 *)&local_288,pSVar11);
        printf("  %s\n",local_1b0._0_8_);
        pSVar11 = extraout_RDX_00;
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
          pSVar11 = extraout_RDX_01;
        }
        uVar12 = uVar12 + 1;
        pbVar9 = (post->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x20;
      } while (uVar12 < (ulong)((long)(post->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >>
                               5));
    }
    puts("Stack after running program:");
    if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_268._M_impl.super__Deque_impl_data._M_start._M_cur) {
      pSVar11 = extraout_RDX_02;
      do {
        pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        local_288._M_dataplus._M_p = pbVar6[-1]._M_dataplus._M_p;
        local_288._M_string_length =
             CONCAT44(local_288._M_string_length._4_4_,(int)pbVar6[-1]._M_string_length);
        CEscape_abi_cxx11_((string *)local_1b0,(re2 *)&local_288,pSVar11);
        printf("  %s\n",local_1b0._0_8_);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        pSVar11 = extraout_RDX_03;
      } while (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_268._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_generator.cc"
               ,0xdb,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Bad regexp program.",0x13);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  pRVar4 = local_1d8;
  pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  (*local_1d8->_vptr_RegexpGenerator[2])(local_1d8,pbVar6 + -1);
  pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::operator+(&local_288,"^(?:",pbVar6 + -1);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_288);
  pcVar2 = local_1b0 + 0x10;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_1b0._16_8_ = *psVar10;
    local_1b0._24_4_ = *(undefined4 *)(plVar7 + 3);
    local_1b0._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_1b0._0_8_ = pcVar2;
  }
  else {
    local_1b0._16_8_ = *psVar10;
    local_1b0._0_8_ = (size_type *)*plVar7;
  }
  local_1b0._8_8_ = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*pRVar4->_vptr_RegexpGenerator[2])(pRVar4);
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  paVar1 = &local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::operator+(&local_288,"^(?:",pbVar6 + -1);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_288);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_1b0._16_8_ = *psVar10;
    local_1b0._24_4_ = *(undefined4 *)(plVar7 + 3);
    local_1b0._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_1b0._0_8_ = pcVar2;
  }
  else {
    local_1b0._16_8_ = *psVar10;
    local_1b0._0_8_ = (size_type *)*plVar7;
  }
  local_1b0._8_8_ = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*pRVar4->_vptr_RegexpGenerator[2])(pRVar4);
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::operator+(&local_288,"(?:",pbVar6 + -1);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_288);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_1b0._16_8_ = *psVar10;
    local_1b0._24_4_ = *(undefined4 *)(plVar7 + 3);
    local_1b0._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_1b0._0_8_ = pcVar2;
  }
  else {
    local_1b0._16_8_ = *psVar10;
    local_1b0._0_8_ = (size_type *)*plVar7;
  }
  local_1b0._8_8_ = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*pRVar4->_vptr_RegexpGenerator[2])(pRVar4);
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_268);
  return;
}

Assistant:

void RegexpGenerator::RunPostfix(const vector<string>& post) {
  stack<string> regexps;
  for (size_t i = 0; i < post.size(); i++) {
    switch (CountArgs(post[i])) {
      default:
        LOG(FATAL) << "Bad operator: " << post[i];
      case 0:
        regexps.push(post[i]);
        break;
      case 1: {
        string a = regexps.top();
        regexps.pop();
        regexps.push("(?:" + StringPrintf(post[i].c_str(), a.c_str()) + ")");
        break;
      }
      case 2: {
        string b = regexps.top();
        regexps.pop();
        string a = regexps.top();
        regexps.pop();
        regexps.push("(?:" +
                     StringPrintf(post[i].c_str(), a.c_str(), b.c_str()) +
                     ")");
        break;
      }
    }
  }

  if (regexps.size() != 1) {
    // Internal error - should never happen.
    printf("Bad regexp program:\n");
    for (size_t i = 0; i < post.size(); i++) {
      printf("  %s\n", CEscape(post[i]).c_str());
    }
    printf("Stack after running program:\n");
    while (!regexps.empty()) {
      printf("  %s\n", CEscape(regexps.top()).c_str());
      regexps.pop();
    }
    LOG(FATAL) << "Bad regexp program.";
  }

  HandleRegexp(regexps.top());
  HandleRegexp("^(?:" + regexps.top() + ")$");
  HandleRegexp("^(?:" + regexps.top() + ")");
  HandleRegexp("(?:" + regexps.top() + ")$");
}